

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::~QPlainTextEdit(QPlainTextEdit *this)

{
  ~QPlainTextEdit(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

QPlainTextEdit::~QPlainTextEdit()
{
    Q_D(QPlainTextEdit);
    if (d->documentLayoutPtr) {
        if (d->documentLayoutPtr->priv()->mainViewPrivate == d)
            d->documentLayoutPtr->priv()->mainViewPrivate = nullptr;
    }
}